

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters_sse42_intr.c
# Opt level: O1

void ihevc_intra_pred_luma_horz_sse42
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  UWORD8 aUVar5 [16];
  long lVar6;
  ulong uVar7;
  long lVar8;
  undefined1 (*pauVar9) [16];
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  short sVar20;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  undefined1 in_XMM3 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  short sVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  aUVar5 = IHEVCE_SHUFFLEMASK4;
  uVar7 = (long)nt * 2;
  if (nt == 0x20) {
    pauVar9 = (undefined1 (*) [16])(pu1_dst + 0x10);
    lVar6 = (long)dst_strd;
    lVar8 = 0x10;
    do {
      auVar35 = *(undefined1 (*) [16])(pu1_ref + lVar8 + ((uVar7 & 0xffffffff) - 0x20));
      auVar34 = pshufb(auVar35 >> 0x38,(undefined1  [16])aUVar5);
      auVar33 = pshufb(auVar35 >> 0x30,(undefined1  [16])aUVar5);
      auVar32 = pshufb(auVar35 >> 0x28,(undefined1  [16])aUVar5);
      auVar31 = pshufb(auVar35 >> 0x20,(undefined1  [16])aUVar5);
      auVar30 = pshufb(auVar35 >> 0x18,(undefined1  [16])aUVar5);
      auVar21 = pshufb(auVar35 >> 0x10,(undefined1  [16])aUVar5);
      auVar22 = pshufb(auVar35 >> 8,(undefined1  [16])aUVar5);
      auVar18 = pshufb(auVar35,(undefined1  [16])aUVar5);
      auVar19 = pshufb(auVar35 >> 0x78,(undefined1  [16])aUVar5);
      auVar41 = pshufb(auVar35 >> 0x70,(undefined1  [16])aUVar5);
      auVar40 = pshufb(auVar35 >> 0x68,(undefined1  [16])aUVar5);
      auVar39 = pshufb(auVar35 >> 0x60,(undefined1  [16])aUVar5);
      auVar38 = pshufb(auVar35 >> 0x58,(undefined1  [16])aUVar5);
      auVar37 = pshufb(auVar35 >> 0x50,(undefined1  [16])aUVar5);
      auVar36 = pshufb(auVar35 >> 0x48,(undefined1  [16])aUVar5);
      auVar35 = pshufb(auVar35 >> 0x40,(undefined1  [16])aUVar5);
      pauVar9[-1] = auVar19;
      *(undefined1 (*) [16])(pauVar9[-1] + lVar6) = auVar41;
      *(undefined1 (*) [16])(pauVar9[-1] + lVar6 * 2) = auVar40;
      *(undefined1 (*) [16])(pauVar9[-1] + lVar6 * 3) = auVar39;
      *(undefined1 (*) [16])(pauVar9[-1] + lVar6 * 4) = auVar38;
      *(undefined1 (*) [16])(pauVar9[-1] + lVar6 * 5) = auVar37;
      *(undefined1 (*) [16])(pauVar9[-1] + lVar6 * 6) = auVar36;
      *(undefined1 (*) [16])(pauVar9[-1] + lVar6 * 7) = auVar35;
      *(undefined1 (*) [16])(pauVar9[-1] + lVar6 * 8) = auVar34;
      *(undefined1 (*) [16])(pauVar9[-1] + lVar6 * 9) = auVar33;
      *(undefined1 (*) [16])(pauVar9[-1] + lVar6 * 10) = auVar32;
      *(undefined1 (*) [16])(pauVar9[-1] + lVar6 * 0xb) = auVar31;
      *(undefined1 (*) [16])(pauVar9[-1] + lVar6 * 0xc) = auVar30;
      local_48 = auVar21._0_8_;
      uStack_40 = auVar21._8_8_;
      *(undefined8 *)(pauVar9[-1] + lVar6 * 0xd) = local_48;
      *(undefined8 *)(pauVar9[-1] + lVar6 * 0xd + 8) = uStack_40;
      *(undefined1 (*) [16])(pauVar9[-1] + lVar6 * 0xe) = auVar22;
      *(undefined1 (*) [16])(pauVar9[-1] + lVar6 * 0xf) = auVar18;
      *pauVar9 = auVar19;
      *(undefined1 (*) [16])(*pauVar9 + lVar6) = auVar41;
      *(undefined1 (*) [16])(*pauVar9 + lVar6 * 2) = auVar40;
      *(undefined1 (*) [16])(*pauVar9 + lVar6 * 3) = auVar39;
      *(undefined1 (*) [16])(*pauVar9 + lVar6 * 4) = auVar38;
      *(undefined1 (*) [16])(*pauVar9 + lVar6 * 5) = auVar37;
      *(undefined1 (*) [16])(*pauVar9 + lVar6 * 6) = auVar36;
      *(undefined1 (*) [16])(*pauVar9 + lVar6 * 7) = auVar35;
      *(undefined1 (*) [16])(*pauVar9 + lVar6 * 8) = auVar34;
      *(undefined1 (*) [16])(*pauVar9 + lVar6 * 9) = auVar33;
      *(undefined1 (*) [16])(*pauVar9 + lVar6 * 10) = auVar32;
      *(undefined1 (*) [16])(*pauVar9 + lVar6 * 0xb) = auVar31;
      local_58 = auVar30._0_8_;
      uStack_50 = auVar30._8_8_;
      *(undefined8 *)(*pauVar9 + lVar6 * 0xc) = local_58;
      *(undefined8 *)(*pauVar9 + lVar6 * 0xc + 8) = uStack_50;
      *(undefined8 *)(*pauVar9 + lVar6 * 0xd) = local_48;
      *(undefined8 *)(*pauVar9 + lVar6 * 0xd + 8) = uStack_40;
      *(undefined1 (*) [16])(*pauVar9 + lVar6 * 0xe) = auVar22;
      *(undefined1 (*) [16])(*pauVar9 + lVar6 * 0xf) = auVar18;
      pauVar9 = pauVar9 + lVar6;
      lVar8 = lVar8 + -0x10;
    } while (lVar8 == 0);
    return;
  }
  auVar35 = pshuflw(ZEXT116(pu1_ref[uVar7 - 1]),ZEXT116(pu1_ref[uVar7 - 1]),0);
  auVar18 = pshuflw(ZEXT116(pu1_ref[uVar7]),ZEXT116(pu1_ref[uVar7]),0);
  auVar19 = pmovzxbw(auVar18,*(undefined8 *)(pu1_ref + uVar7 + 1));
  sVar20 = auVar18._0_2_;
  auVar21._0_2_ = auVar19._0_2_ - sVar20;
  sVar23 = auVar18._2_2_;
  auVar21._2_2_ = auVar19._2_2_ - sVar23;
  auVar21._4_2_ = auVar19._4_2_ - sVar20;
  auVar21._6_2_ = auVar19._6_2_ - sVar23;
  auVar21._8_2_ = auVar19._8_2_ - sVar20;
  auVar21._10_2_ = auVar19._10_2_ - sVar23;
  auVar21._12_2_ = auVar19._12_2_ - sVar20;
  auVar21._14_2_ = auVar19._14_2_ - sVar23;
  auVar18 = psraw(auVar21,1);
  sVar28 = auVar35._0_2_;
  sVar10 = auVar18._0_2_ + sVar28;
  sVar29 = auVar35._2_2_;
  sVar11 = auVar18._2_2_ + sVar29;
  sVar12 = auVar18._4_2_ + sVar28;
  sVar13 = auVar18._6_2_ + sVar29;
  sVar14 = auVar18._8_2_ + sVar28;
  sVar15 = auVar18._10_2_ + sVar29;
  sVar16 = auVar18._12_2_ + sVar28;
  sVar17 = auVar18._14_2_ + sVar29;
  cVar1 = (char)sVar10;
  cVar2 = (char)sVar11;
  cVar3 = (char)sVar12;
  cVar4 = (char)sVar13;
  if (nt == 0x10) {
    auVar35 = pmovzxbw(in_XMM3,*(undefined8 *)(pu1_ref + uVar7 + 9));
    auVar18._0_2_ = auVar35._0_2_ - sVar20;
    auVar18._2_2_ = auVar35._2_2_ - sVar23;
    auVar18._4_2_ = auVar35._4_2_ - sVar20;
    auVar18._6_2_ = auVar35._6_2_ - sVar23;
    auVar18._8_2_ = auVar35._8_2_ - sVar20;
    auVar18._10_2_ = auVar35._10_2_ - sVar23;
    auVar18._12_2_ = auVar35._12_2_ - sVar20;
    auVar18._14_2_ = auVar35._14_2_ - sVar23;
    auVar35 = psraw(auVar18,1);
    sVar20 = auVar35._0_2_ + sVar28;
    sVar23 = auVar35._2_2_ + sVar29;
    sVar24 = auVar35._4_2_ + sVar28;
    sVar25 = auVar35._6_2_ + sVar29;
    sVar26 = auVar35._8_2_ + sVar28;
    sVar27 = auVar35._10_2_ + sVar29;
    sVar28 = auVar35._12_2_ + sVar28;
    sVar29 = auVar35._14_2_ + sVar29;
    *pu1_dst = (0 < sVar10) * (sVar10 < 0x100) * cVar1 - (0xff < sVar10);
    pu1_dst[1] = (0 < sVar11) * (sVar11 < 0x100) * cVar2 - (0xff < sVar11);
    pu1_dst[2] = (0 < sVar12) * (sVar12 < 0x100) * cVar3 - (0xff < sVar12);
    pu1_dst[3] = (0 < sVar13) * (sVar13 < 0x100) * cVar4 - (0xff < sVar13);
    pu1_dst[4] = (0 < sVar14) * (sVar14 < 0x100) * (char)sVar14 - (0xff < sVar14);
    pu1_dst[5] = (0 < sVar15) * (sVar15 < 0x100) * (char)sVar15 - (0xff < sVar15);
    pu1_dst[6] = (0 < sVar16) * (sVar16 < 0x100) * (char)sVar16 - (0xff < sVar16);
    pu1_dst[7] = (0 < sVar17) * (sVar17 < 0x100) * (char)sVar17 - (0xff < sVar17);
    pu1_dst[8] = (0 < sVar20) * (sVar20 < 0x100) * (char)sVar20 - (0xff < sVar20);
    pu1_dst[9] = (0 < sVar23) * (sVar23 < 0x100) * (char)sVar23 - (0xff < sVar23);
    pu1_dst[10] = (0 < sVar24) * (sVar24 < 0x100) * (char)sVar24 - (0xff < sVar24);
    pu1_dst[0xb] = (0 < sVar25) * (sVar25 < 0x100) * (char)sVar25 - (0xff < sVar25);
    pu1_dst[0xc] = (0 < sVar26) * (sVar26 < 0x100) * (char)sVar26 - (0xff < sVar26);
    pu1_dst[0xd] = (0 < sVar27) * (sVar27 < 0x100) * (char)sVar27 - (0xff < sVar27);
    pu1_dst[0xe] = (0 < sVar28) * (sVar28 < 0x100) * (char)sVar28 - (0xff < sVar28);
    pu1_dst[0xf] = (0 < sVar29) * (sVar29 < 0x100) * (char)sVar29 - (0xff < sVar29);
    uVar7 = uVar7 & 0xffffffff;
    auVar35 = pshufb(ZEXT116(pu1_ref[uVar7 - 2]),(undefined1  [16])0x0);
    auVar18 = pshufb(ZEXT116(pu1_ref[uVar7 - 3]),(undefined1  [16])0x0);
    auVar19 = pshufb(ZEXT116(pu1_ref[uVar7 - 4]),(undefined1  [16])0x0);
    auVar21 = pshufb(ZEXT116(pu1_ref[uVar7 - 5]),(undefined1  [16])0x0);
    auVar22 = pshufb(ZEXT116(pu1_ref[uVar7 - 6]),(undefined1  [16])0x0);
    auVar30 = pshufb(ZEXT116(pu1_ref[uVar7 - 7]),(undefined1  [16])0x0);
    auVar31 = pshufb(ZEXT116(pu1_ref[uVar7 - 8]),(undefined1  [16])0x0);
    auVar32 = pshufb(ZEXT116(pu1_ref[uVar7 - 9]),(undefined1  [16])0x0);
    lVar6 = (long)dst_strd;
    *(undefined1 (*) [16])(pu1_dst + lVar6) = auVar35;
    *(undefined1 (*) [16])(pu1_dst + lVar6 * 2) = auVar18;
    *(undefined1 (*) [16])(pu1_dst + lVar6 * 3) = auVar19;
    *(undefined1 (*) [16])(pu1_dst + lVar6 * 4) = auVar21;
    *(undefined1 (*) [16])(pu1_dst + lVar6 * 5) = auVar22;
    *(undefined1 (*) [16])(pu1_dst + lVar6 * 6) = auVar30;
    *(undefined1 (*) [16])(pu1_dst + lVar6 * 7) = auVar31;
    *(undefined1 (*) [16])(pu1_dst + lVar6 * 8) = auVar32;
    auVar35 = pshufb(ZEXT116(pu1_ref[uVar7 - 10]),(undefined1  [16])0x0);
    auVar18 = pshufb(ZEXT116(pu1_ref[uVar7 - 0xb]),(undefined1  [16])0x0);
    auVar19 = pshufb(ZEXT116(pu1_ref[uVar7 - 0xc]),(undefined1  [16])0x0);
    auVar21 = pshufb(ZEXT116(pu1_ref[uVar7 - 0xd]),(undefined1  [16])0x0);
    auVar22 = pshufb(ZEXT116(pu1_ref[uVar7 - 0xe]),(undefined1  [16])0x0);
    auVar30 = pshufb(ZEXT116(pu1_ref[uVar7 - 0xf]),(undefined1  [16])0x0);
    auVar31 = pshufb(ZEXT116(pu1_ref[uVar7 - 0x10]),(undefined1  [16])0x0);
    *(undefined1 (*) [16])(pu1_dst + lVar6 * 9) = auVar35;
    *(undefined1 (*) [16])(pu1_dst + lVar6 * 10) = auVar18;
    *(undefined1 (*) [16])(pu1_dst + lVar6 * 0xb) = auVar19;
    *(undefined1 (*) [16])(pu1_dst + lVar6 * 0xc) = auVar21;
    *(undefined1 (*) [16])(pu1_dst + lVar6 * 0xd) = auVar22;
    *(undefined1 (*) [16])(pu1_dst + lVar6 * 0xe) = auVar30;
    *(undefined1 (*) [16])(pu1_dst + lVar6 * 0xf) = auVar31;
  }
  else {
    if (nt == 8) {
      uVar7 = uVar7 & 0xffffffff;
      auVar35 = pshufb(ZEXT116(pu1_ref[uVar7 - 2]),(undefined1  [16])0x0);
      auVar18 = pshufb(ZEXT116(pu1_ref[uVar7 - 3]),(undefined1  [16])0x0);
      auVar19 = pshufb(ZEXT116(pu1_ref[uVar7 - 4]),(undefined1  [16])0x0);
      auVar21 = pshufb(ZEXT116(pu1_ref[uVar7 - 5]),(undefined1  [16])0x0);
      auVar22 = pshufb(ZEXT116(pu1_ref[uVar7 - 6]),(undefined1  [16])0x0);
      auVar30 = pshufb(ZEXT116(pu1_ref[uVar7 - 7]),(undefined1  [16])0x0);
      auVar31 = pshufb(ZEXT116(pu1_ref[uVar7 - 8]),(undefined1  [16])0x0);
      *(ulong *)pu1_dst =
           CONCAT17((0 < sVar17) * (sVar17 < 0x100) * (char)sVar17 - (0xff < sVar17),
                    CONCAT16((0 < sVar16) * (sVar16 < 0x100) * (char)sVar16 - (0xff < sVar16),
                             CONCAT15((0 < sVar15) * (sVar15 < 0x100) * (char)sVar15 -
                                      (0xff < sVar15),
                                      CONCAT14((0 < sVar14) * (sVar14 < 0x100) * (char)sVar14 -
                                               (0xff < sVar14),
                                               CONCAT13((0 < sVar13) * (sVar13 < 0x100) * cVar4 -
                                                        (0xff < sVar13),
                                                        CONCAT12((0 < sVar12) * (sVar12 < 0x100) *
                                                                 cVar3 - (0xff < sVar12),
                                                                 CONCAT11((0 < sVar11) *
                                                                          (sVar11 < 0x100) * cVar2 -
                                                                          (0xff < sVar11),
                                                                          (0 < sVar10) *
                                                                          (sVar10 < 0x100) * cVar1 -
                                                                          (0xff < sVar10))))))));
      lVar6 = (long)dst_strd;
      *(long *)(pu1_dst + lVar6) = auVar35._0_8_;
      *(long *)(pu1_dst + lVar6 * 2) = auVar18._0_8_;
      *(long *)(pu1_dst + lVar6 * 3) = auVar19._0_8_;
      *(long *)(pu1_dst + lVar6 * 4) = auVar21._0_8_;
      *(long *)(pu1_dst + lVar6 * 5) = auVar22._0_8_;
      *(long *)(pu1_dst + lVar6 * 6) = auVar30._0_8_;
      *(long *)(pu1_dst + lVar6 * 7) = auVar31._0_8_;
      return;
    }
    if (nt == 4) {
      *(uint *)pu1_dst =
           CONCAT13((0 < sVar13) * (sVar13 < 0x100) * cVar4 - (0xff < sVar13),
                    CONCAT12((0 < sVar12) * (sVar12 < 0x100) * cVar3 - (0xff < sVar12),
                             CONCAT11((0 < sVar11) * (sVar11 < 0x100) * cVar2 - (0xff < sVar11),
                                      (0 < sVar10) * (sVar10 < 0x100) * cVar1 - (0xff < sVar10))));
      uVar7 = uVar7 & 0xffffffff;
      auVar35 = pshufb(ZEXT116(pu1_ref[uVar7 - 2]),(undefined1  [16])0x0);
      auVar18 = pshufb(ZEXT116(pu1_ref[uVar7 - 3]),(undefined1  [16])0x0);
      auVar19 = pshufb(ZEXT116(pu1_ref[uVar7 - 4]),(undefined1  [16])0x0);
      lVar6 = (long)dst_strd;
      *(int *)(pu1_dst + lVar6) = auVar35._0_4_;
      *(int *)(pu1_dst + lVar6 * 2) = auVar18._0_4_;
      *(int *)(pu1_dst + lVar6 * 3) = auVar19._0_4_;
      return;
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_horz_sse42(UWORD8 *pu1_ref,
                                      WORD32 src_strd,
                                      UWORD8 *pu1_dst,
                                      WORD32 dst_strd,
                                      WORD32 nt,
                                      WORD32 mode)
{

    WORD32 row;
    WORD32 two_nt;
    UNUSED(src_strd);
    UNUSED(mode);

    two_nt = 2 * nt;


    if(nt == 32)
    {
        __m128i src_temp1, src_temp2, src_temp3, src_temp4, src_temp5, src_temp6, src_temp7, src_temp8;
        __m128i src_temp9, src_temp10, src_temp11, src_temp12, src_temp13, src_temp14, src_temp15, src_temp16;
        __m128i sm = _mm_loadu_si128((__m128i *)&IHEVCE_SHUFFLEMASK4[0]);

        for(row = 0; row < nt; row += 16)
        {
            {
                src_temp1 =  _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 1 - row - 15));

                src_temp2 =  _mm_srli_si128(src_temp1, 1);
                src_temp3 =  _mm_srli_si128(src_temp1, 2);
                src_temp4 =  _mm_srli_si128(src_temp1, 3);
                src_temp5 =  _mm_srli_si128(src_temp1, 4);
                src_temp6 =  _mm_srli_si128(src_temp1, 5);
                src_temp7 =  _mm_srli_si128(src_temp1, 6);
                src_temp8 =  _mm_srli_si128(src_temp1, 7);

                src_temp9 =  _mm_srli_si128(src_temp1, 8);
                src_temp10 =  _mm_srli_si128(src_temp1, 9);
                src_temp11 =  _mm_srli_si128(src_temp1, 10);
                src_temp12 =  _mm_srli_si128(src_temp1, 11);
                src_temp13 =  _mm_srli_si128(src_temp1, 12);
                src_temp14 =  _mm_srli_si128(src_temp1, 13);
                src_temp15 =  _mm_srli_si128(src_temp1, 14);
                src_temp16 =  _mm_srli_si128(src_temp1, 15);

                src_temp8 =  _mm_shuffle_epi8(src_temp8, sm);
                src_temp7 =  _mm_shuffle_epi8(src_temp7, sm);
                src_temp6 =  _mm_shuffle_epi8(src_temp6, sm);
                src_temp5 =  _mm_shuffle_epi8(src_temp5, sm);
                src_temp4 =  _mm_shuffle_epi8(src_temp4, sm);
                src_temp3 =  _mm_shuffle_epi8(src_temp3, sm);
                src_temp2 =  _mm_shuffle_epi8(src_temp2, sm);
                src_temp1 =  _mm_shuffle_epi8(src_temp1, sm);

                src_temp16 =  _mm_shuffle_epi8(src_temp16, sm);
                src_temp15 =  _mm_shuffle_epi8(src_temp15, sm);
                src_temp14 =  _mm_shuffle_epi8(src_temp14, sm);
                src_temp13 =  _mm_shuffle_epi8(src_temp13, sm);
                src_temp12 =  _mm_shuffle_epi8(src_temp12, sm);
                src_temp11 =  _mm_shuffle_epi8(src_temp11, sm);
                src_temp10 =  _mm_shuffle_epi8(src_temp10, sm);
                src_temp9 =  _mm_shuffle_epi8(src_temp9, sm);

                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 0) * dst_strd)), src_temp16);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 1) * dst_strd)), src_temp15);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 2) * dst_strd)), src_temp14);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 3) * dst_strd)), src_temp13);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 4) * dst_strd)), src_temp12);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 5) * dst_strd)), src_temp11);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 6) * dst_strd)), src_temp10);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 7) * dst_strd)), src_temp9);

                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 8) * dst_strd)), src_temp8);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 9) * dst_strd)), src_temp7);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 10) * dst_strd)), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 11) * dst_strd)), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 12) * dst_strd)), src_temp4);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 13) * dst_strd)), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 14) * dst_strd)), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 15) * dst_strd)), src_temp1);

                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 0) * dst_strd)), src_temp16);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 1) * dst_strd)), src_temp15);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 2) * dst_strd)), src_temp14);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 3) * dst_strd)), src_temp13);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 4) * dst_strd)), src_temp12);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 5) * dst_strd)), src_temp11);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 6) * dst_strd)), src_temp10);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 7) * dst_strd)), src_temp9);

                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 8) * dst_strd)), src_temp8);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 9) * dst_strd)), src_temp7);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 10) * dst_strd)), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 11) * dst_strd)), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 12) * dst_strd)), src_temp4);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 13) * dst_strd)), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 14) * dst_strd)), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 15) * dst_strd)), src_temp1);

            }

        }

    }
    else

    {
        __m128i src_temp1, src_temp2, src_temp3, src_temp4, src_temp5, src_temp6;
        __m128i src_temp10, zero_8x16b, src_temp7;

        /* DC filtering for the first top row and first left column */

        zero_8x16b = _mm_set1_epi16(0);

        /*Filtering done for the 1st row */

        src_temp2 =  _mm_set1_epi16(pu1_ref[two_nt - 1]);
        src_temp10 =  _mm_set1_epi16(pu1_ref[two_nt]);

        /*  loding 8-bit 16 pixels */
        src_temp4 =  _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));

        src_temp4 =  _mm_cvtepu8_epi16(src_temp4);

        /*(pu1_ref[two_nt + 1 + col] - pu1_ref[two_nt])*/
        src_temp3 = _mm_sub_epi16(src_temp4, src_temp10);

        /* ((pu1_ref[two_nt + 1 + col] - pu1_ref[two_nt]) >> 1)*/
        src_temp3 = _mm_srai_epi16(src_temp3, 1);

        /* pu1_ref[two_nt - 1]+((pu1_ref[two_nt + 1 + col] - pu1_ref[two_nt]) >> 1)*/
        src_temp3 = _mm_add_epi16(src_temp2, src_temp3);

        if(nt == 4)
        {
            int temp1, temp2, temp3;
            src_temp3 = _mm_packus_epi16(src_temp3, zero_8x16b);
            temp1 = _mm_cvtsi128_si32(src_temp3);

            *(WORD32 *)(&pu1_dst[0]) = temp1;

            src_temp2 =  _mm_set1_epi8(pu1_ref[two_nt - 2]);
            src_temp3 =  _mm_set1_epi8(pu1_ref[two_nt - 3]);
            src_temp4 =  _mm_set1_epi8(pu1_ref[two_nt - 4]);

            temp1 = _mm_cvtsi128_si32(src_temp2);
            temp2 = _mm_cvtsi128_si32(src_temp3);
            temp3 = _mm_cvtsi128_si32(src_temp4);

            /*pu1_dst[(row * dst_strd) + col] = pu1_ref[two_nt - 1 - row];*/
            *(WORD32 *)(&pu1_dst[(1 * dst_strd)]) = temp1;
            *(WORD32 *)(&pu1_dst[(2 * dst_strd)]) = temp2;
            *(WORD32 *)(&pu1_dst[(3 * dst_strd)]) = temp3;

        }
        else if(nt == 8)
        {
            src_temp10 = _mm_packus_epi16(src_temp3, zero_8x16b);


            src_temp1 =  _mm_set1_epi8(pu1_ref[two_nt - 2]);
            src_temp2 =  _mm_set1_epi8(pu1_ref[two_nt - 3]);
            src_temp3 =  _mm_set1_epi8(pu1_ref[two_nt - 4]);
            src_temp4 =  _mm_set1_epi8(pu1_ref[two_nt - 5]);
            src_temp5 =  _mm_set1_epi8(pu1_ref[two_nt - 6]);
            src_temp6 =  _mm_set1_epi8(pu1_ref[two_nt - 7]);
            src_temp7 =  _mm_set1_epi8(pu1_ref[two_nt - 8]);

            _mm_storel_epi64((__m128i *)(pu1_dst), src_temp10);

            /*pu1_dst[(row * dst_strd) + col] = pu1_ref[two_nt - 1 - row];*/
            _mm_storel_epi64((__m128i *)(pu1_dst + (1 * dst_strd)), src_temp1);
            _mm_storel_epi64((__m128i *)(pu1_dst + (2 * dst_strd)), src_temp2);
            _mm_storel_epi64((__m128i *)(pu1_dst + (3 * dst_strd)), src_temp3);
            _mm_storel_epi64((__m128i *)(pu1_dst + (4 * dst_strd)), src_temp4);
            _mm_storel_epi64((__m128i *)(pu1_dst + (5 * dst_strd)), src_temp5);
            _mm_storel_epi64((__m128i *)(pu1_dst + (6 * dst_strd)), src_temp6);
            _mm_storel_epi64((__m128i *)(pu1_dst + (7 * dst_strd)), src_temp7);

        }
        else if(nt == 16)
        {
            src_temp4 =  _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1 + 8));
            src_temp4 =  _mm_cvtepu8_epi16(src_temp4);

            src_temp10 = _mm_sub_epi16(src_temp4, src_temp10);
            src_temp10 = _mm_srai_epi16(src_temp10, 1);
            src_temp10 = _mm_add_epi16(src_temp2, src_temp10);

            src_temp3 = _mm_packus_epi16(src_temp3, src_temp10);
            _mm_storeu_si128((__m128i *)(pu1_dst), src_temp3);

            /*pu1_dst[(row * dst_strd) + col] = pu1_ref[two_nt - 1 - row];*/
            src_temp1 =  _mm_set1_epi8(pu1_ref[two_nt - 2]);
            src_temp2 =  _mm_set1_epi8(pu1_ref[two_nt - 3]);
            src_temp3 =  _mm_set1_epi8(pu1_ref[two_nt - 4]);
            src_temp4 =  _mm_set1_epi8(pu1_ref[two_nt - 5]);
            src_temp5 =  _mm_set1_epi8(pu1_ref[two_nt - 6]);
            src_temp6 =  _mm_set1_epi8(pu1_ref[two_nt - 7]);
            src_temp7 =  _mm_set1_epi8(pu1_ref[two_nt - 8]);
            src_temp10 =  _mm_set1_epi8(pu1_ref[two_nt - 9]);

            _mm_storeu_si128((__m128i *)(pu1_dst + ((1) * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((2) * dst_strd)), src_temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((3) * dst_strd)), src_temp3);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((4) * dst_strd)), src_temp4);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((5) * dst_strd)), src_temp5);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((6) * dst_strd)), src_temp6);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((7) * dst_strd)), src_temp7);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((8) * dst_strd)), src_temp10);

            src_temp1 =  _mm_set1_epi8(pu1_ref[two_nt - 10]);
            src_temp2 =  _mm_set1_epi8(pu1_ref[two_nt - 11]);
            src_temp3 =  _mm_set1_epi8(pu1_ref[two_nt - 12]);
            src_temp4 =  _mm_set1_epi8(pu1_ref[two_nt - 13]);
            src_temp5 =  _mm_set1_epi8(pu1_ref[two_nt - 14]);
            src_temp6 =  _mm_set1_epi8(pu1_ref[two_nt - 15]);
            src_temp7 =  _mm_set1_epi8(pu1_ref[two_nt - 16]);

            _mm_storeu_si128((__m128i *)(pu1_dst + ((9) * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((10) * dst_strd)), src_temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((11) * dst_strd)), src_temp3);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((12) * dst_strd)), src_temp4);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((13) * dst_strd)), src_temp5);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((14) * dst_strd)), src_temp6);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((15) * dst_strd)), src_temp7);

        }
    }
}